

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::ArrowTableFunction::ArrowToDuckDB
               (ArrowScanLocalState *scan_state,arrow_column_map_t *arrow_convert_data,
               DataChunk *output,idx_t start,bool arrow_scan_is_projected,idx_t rowid_column_index)

{
  shared_ptr<duckdb::ArrowArrayWrapper,_true> *this;
  ArrowArray *array;
  long lVar1;
  idx_t size;
  bool bVar2;
  reference pvVar3;
  value_type vVar4;
  ArrowArrayWrapper *pAVar5;
  ArrowArrayWrapper *pAVar6;
  const_iterator cVar7;
  type this_00;
  ArrowArrayScanState *array_state;
  reference pvVar8;
  InvalidInputException *pIVar9;
  ulong uVar10;
  ulong uVar11;
  undefined7 in_register_00000081;
  size_type __n;
  unsigned_long col_idx;
  uint64_t in_stack_ffffffffffffff40;
  ulong local_88;
  undefined4 local_7c;
  idx_t local_78;
  ArrowType *local_70;
  int64_t local_68;
  vector<unsigned_long,_true> *local_60;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  string local_50;
  
  local_7c = (undefined4)CONCAT71(in_register_00000081,arrow_scan_is_projected);
  if ((output->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (output->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_60 = &scan_state->column_ids;
    this = &scan_state->chunk;
    __n = 0;
    local_78 = rowid_column_index;
    local_58 = &arrow_convert_data->_M_h;
    do {
      vVar4 = __n;
      if ((scan_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (scan_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pvVar3 = vector<unsigned_long,_true>::operator[](local_60,__n);
        vVar4 = *pvVar3;
      }
      uVar10 = vVar4;
      if ((char)local_7c != '\0') {
        uVar10 = __n;
      }
      local_88 = vVar4;
      if (rowid_column_index == 0xffffffffffffffff) {
        uVar11 = uVar10;
        if (vVar4 != 0xffffffffffffffff) goto LAB_00a4fdc9;
      }
      else {
        uVar11 = rowid_column_index;
        if ((vVar4 != 0xffffffffffffffff) && (uVar11 = uVar10, rowid_column_index <= vVar4)) {
          local_88 = vVar4 + 1;
          uVar11 = uVar10 + 1;
        }
LAB_00a4fdc9:
        pAVar5 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(this);
        pAVar6 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(this);
        array = (pAVar6->arrow_array).children[uVar11];
        if (array->release == (_func_void_ArrowArray_ptr *)0x0) {
          pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"arrow_scan: released array passed","");
          InvalidInputException::InvalidInputException(pIVar9,&local_50);
          __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        lVar1 = array->length;
        pAVar6 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(this);
        if (lVar1 != (pAVar6->arrow_array).length) {
          pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"arrow_scan: array length mismatch","");
          InvalidInputException::InvalidInputException(pIVar9,&local_50);
          __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        cVar7 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_58,&local_88);
        if (cVar7.
            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          ::std::__throw_out_of_range("_Map_base::at");
        }
        this_00 = shared_ptr<duckdb::ArrowType,_true>::operator*
                            ((shared_ptr<duckdb::ArrowType,_true> *)
                             ((long)cVar7.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_false>
                                    ._M_cur + 0x10));
        array_state = ArrowScanLocalState::GetState(scan_state,local_88);
        if ((array_state->owned_data).internal.
            super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&array_state->owned_data,this);
        }
        bVar2 = ArrowType::HasDictionary(this_00);
        if (bVar2) {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
          in_stack_ffffffffffffff40 = 0;
          ColumnArrowToDuckDBDictionary
                    (pvVar8,array,array_state,output->count,this_00,-1,(ValidityMask *)0x0,0);
        }
        else {
          bVar2 = ArrowType::RunEndEncoded(this_00);
          local_70 = this_00;
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
          size = output->count;
          if (bVar2) {
            ColumnArrowToDuckDBRunEndEncoded
                      (pvVar8,array,array_state,size,local_70,-1,(ValidityMask *)0x0,
                       in_stack_ffffffffffffff40);
            rowid_column_index = local_78;
          }
          else {
            local_68 = (pAVar5->arrow_array).offset;
            FlatVector::VerifyFlatVector(pvVar8);
            GetValidityMask(&pvVar8->validity,array,(ArrowScanLocalState *)scan_state->chunk_offset,
                            size,local_68,-1,false);
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
            in_stack_ffffffffffffff40 = 0;
            ColumnArrowToDuckDB(pvVar8,array,array_state,output->count,local_70,-1,
                                (ValidityMask *)0x0,0,false);
            rowid_column_index = local_78;
          }
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(output->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(output->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

void ArrowTableFunction::ArrowToDuckDB(ArrowScanLocalState &scan_state, const arrow_column_map_t &arrow_convert_data,
                                       DataChunk &output, idx_t start, bool arrow_scan_is_projected,
                                       idx_t rowid_column_index) {
	for (idx_t idx = 0; idx < output.ColumnCount(); idx++) {
		auto col_idx = scan_state.column_ids.empty() ? idx : scan_state.column_ids[idx];

		// If projection was not pushed down into the arrow scanner, but projection pushdown is enabled on the
		// table function, we need to use original column ids here.
		auto arrow_array_idx = arrow_scan_is_projected ? idx : col_idx;

		if (rowid_column_index != COLUMN_IDENTIFIER_ROW_ID) {
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				arrow_array_idx = rowid_column_index;
			} else if (col_idx >= rowid_column_index) {
				// Since the rowid column is skipped when the table is bound (its not a named column),
				// we need to shift references forward in the Arrow array by one to match the alignment
				// that DuckDB believes the Arrow array is in.
				col_idx += 1;
				arrow_array_idx += 1;
			}
		} else {
			// If there isn't any defined row_id_index, and we're asked for it, skip the column.
			// This is the incumbent behavior.
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				continue;
			}
		}

		auto &parent_array = scan_state.chunk->arrow_array;
		auto &array = *scan_state.chunk->arrow_array.children[arrow_array_idx];
		if (!array.release) {
			throw InvalidInputException("arrow_scan: released array passed");
		}
		if (array.length != scan_state.chunk->arrow_array.length) {
			throw InvalidInputException("arrow_scan: array length mismatch");
		}

		D_ASSERT(arrow_convert_data.find(col_idx) != arrow_convert_data.end());
		auto &arrow_type = *arrow_convert_data.at(col_idx);
		auto &array_state = scan_state.GetState(col_idx);

		// Make sure this Vector keeps the Arrow chunk alive in case we can zero-copy the data
		if (!array_state.owned_data) {
			array_state.owned_data = scan_state.chunk;
		}

		auto array_physical_type = GetArrowArrayPhysicalType(arrow_type);

		switch (array_physical_type) {
		case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
			ColumnArrowToDuckDBDictionary(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		case ArrowArrayPhysicalType::RUN_END_ENCODED:
			ColumnArrowToDuckDBRunEndEncoded(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		case ArrowArrayPhysicalType::DEFAULT:
			SetValidityMask(output.data[idx], array, scan_state, output.size(), parent_array.offset, -1);
			ColumnArrowToDuckDB(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		default:
			throw NotImplementedException("ArrowArrayPhysicalType not recognized");
		}
	}
}